

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetLinkLibrariesCommand.cxx
# Opt level: O2

void __thiscall
anon_unknown.dwarf_124bedb::TLL::AppendProperty(TLL *this,string *prop,string *value)

{
  cmTarget *this_00;
  undefined1 local_48 [16];
  _Optional_payload_base<cmListFileBacktrace> local_38;
  
  AffectsProperty(this,prop);
  this_00 = this->Target;
  cmMakefile::GetBacktrace((cmMakefile *)local_48);
  local_38._M_payload._M_value.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)local_48._0_8_;
  local_38._M_payload._M_value.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi =
       (__shared_count<(__gnu_cxx::_Lock_policy)2>)
       (__shared_count<(__gnu_cxx::_Lock_policy)2>)local_48._8_8_;
  local_48._0_8_ = (_Map_pointer)0x0;
  local_48._8_8_ = 0;
  local_38._M_engaged = true;
  cmTarget::AppendProperty(this_00,prop,value,(optional<cmListFileBacktrace> *)&local_38,false);
  std::_Optional_payload_base<cmListFileBacktrace>::_M_reset(&local_38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_48 + 8));
  return;
}

Assistant:

void TLL::AppendProperty(std::string const& prop, std::string const& value)
{
  this->AffectsProperty(prop);
  this->Target->AppendProperty(prop, value, this->Makefile.GetBacktrace());
}